

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall ast::IfStmt::~IfStmt(IfStmt *this)

{
  (this->super_Stmt).super_Node._vptr_Node = (_func_int **)&PTR__IfStmt_00169738;
  if (this->condition != (Expr *)0x0) {
    (*(this->condition->super_Node)._vptr_Node[1])();
  }
  if (this->body != (BlockStmt *)0x0) {
    (*(this->body->super_Stmt).super_Node._vptr_Node[1])();
  }
  if (this->alternative != (BlockStmt *)0x0) {
    (*(this->alternative->super_Stmt).super_Node._vptr_Node[1])();
  }
  token::Token::~Token(&this->tok);
  return;
}

Assistant:

~IfStmt(){
        delete condition;
        delete body;
        delete alternative;
    }